

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 absl::operator*(uint128 lhs,uint128 rhs)

{
  undefined1 v [16];
  unsigned___int128 *puVar1;
  undefined8 extraout_RDX;
  uint128 *this;
  undefined8 uVar2;
  uint64_t local_38;
  uint128 rhs_local;
  uint128 lhs_local;
  
  rhs_local.lo_ = rhs.hi_;
  local_38 = rhs.lo_;
  this = (uint128 *)lhs.hi_;
  rhs_local.hi_ = lhs.lo_;
  lhs_local.lo_ = (uint64_t)this;
  puVar1 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&rhs_local.hi_,this);
  uVar2 = extraout_RDX;
  uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&local_38,this);
  v._8_8_ = uVar2;
  v._0_8_ = puVar1;
  uint128::uint128((uint128 *)&lhs_local.hi_,(unsigned___int128)v);
  return stack0xffffffffffffffe8;
}

Assistant:

inline uint128 operator*(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // TODO(strel) Remove once alignment issues are resolved and unsigned __int128
  // can be used for uint128 storage.
  return static_cast<unsigned __int128>(lhs) *
         static_cast<unsigned __int128>(rhs);
#elif defined(_MSC_VER) && defined(_M_X64) && !defined(_M_ARM64EC)
  uint64_t carry;
  uint64_t low = _umul128(Uint128Low64(lhs), Uint128Low64(rhs), &carry);
  return MakeUint128(Uint128Low64(lhs) * Uint128High64(rhs) +
                         Uint128High64(lhs) * Uint128Low64(rhs) + carry,
                     low);
#else   // ABSL_HAVE_INTRINSIC128
  uint64_t a32 = Uint128Low64(lhs) >> 32;
  uint64_t a00 = Uint128Low64(lhs) & 0xffffffff;
  uint64_t b32 = Uint128Low64(rhs) >> 32;
  uint64_t b00 = Uint128Low64(rhs) & 0xffffffff;
  uint128 result =
      MakeUint128(Uint128High64(lhs) * Uint128Low64(rhs) +
                      Uint128Low64(lhs) * Uint128High64(rhs) + a32 * b32,
                  a00 * b00);
  result += uint128(a32 * b00) << 32;
  result += uint128(a00 * b32) << 32;
  return result;
#endif  // ABSL_HAVE_INTRINSIC128
}